

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

void N_VDiv_ManyVector(N_Vector x,N_Vector y,N_Vector z)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < *(long *)*in_RDI; local_28 = local_28 + 1) {
    N_VDiv(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_28 * 8),
           *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_28 * 8),
           *(undefined8 *)(*(long *)(*in_RDX + 0x10) + local_28 * 8));
  }
  return;
}

Assistant:

void MVAPPEND(N_VDiv)(N_Vector x, N_Vector y, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    N_VDiv(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(y, i),
           MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}